

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

result_type __thiscall
math::wide_integer::uniform_int_distribution<24u,unsigned_char,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<24u,unsigned_char,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  value_type_conflict4 *pvVar1;
  char *pcVar2;
  undefined3 uVar3;
  undefined3 uVar4;
  long lVar5;
  array<unsigned_char,_3UL> aVar6;
  unsigned_fast_type i;
  value_type_conflict4 *pvVar7;
  ushort uVar8;
  long lVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  result_type range;
  result_type result;
  value_type_conflict4 vStack_2d;
  uintwide_t<24U,_unsigned_char,_void,_false> local_2c;
  value_type_conflict4 vStack_29;
  uintwide_t<24U,_unsigned_char,_void,_false> local_28;
  char cStack_25;
  undefined2 local_24;
  value_type_conflict4 local_22;
  array<unsigned_char,_3UL> local_20;
  char acStack_1d [5];
  
  pvVar7 = local_20.elems;
  local_20.elems[0] = '\0';
  local_20.elems[1] = '\0';
  local_20.elems[2] = '\0';
  uVar11 = input_generator->_M_x;
  lVar9 = 0;
  uVar12 = 0;
  do {
    if (lVar9 == 0) {
      uVar13 = (uVar11 % 0xadc8) * 0xbc8f;
      uVar12 = (uVar11 / 0xadc8) * 0xd47;
      uVar11 = (uVar11 / 0xadc8) * -0xd47;
      if (uVar13 < uVar12) {
        uVar11 = uVar12 ^ 0x7fffffff;
      }
      uVar11 = uVar11 + uVar13;
      input_generator->_M_x = uVar11;
      uVar12 = uVar11;
    }
    *pvVar7 = *pvVar7 | (byte)(uVar12 >> ((byte)lVar9 & 0x1f));
    lVar9 = lVar9 + 8;
    pvVar7 = pvVar7 + 1;
  } while (lVar9 != 0x18);
  uVar3 = *(undefined3 *)(input_params->param_a).values.super_array<unsigned_char,_3UL>.elems;
  local_2c.values.super_array<unsigned_char,_3UL>.elems[2] =
       (input_params->param_a).values.super_array<unsigned_char,_3UL>.elems[2];
  local_2c.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
       *(undefined2 *)(input_params->param_a).values.super_array<unsigned_char,_3UL>.elems;
  local_28.values.super_array<unsigned_char,_3UL>.elems[2] = '\0';
  local_28.values.super_array<unsigned_char,_3UL>.elems[0] = '\0';
  local_28.values.super_array<unsigned_char,_3UL>.elems[1] = '\0';
  lVar9 = 2;
LAB_001454ca:
  if (lVar9 != -1) goto code_r0x001454d0;
  uVar4 = *(undefined3 *)(input_params->param_b).values.super_array<unsigned_char,_3UL>.elems;
  local_22 = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[2];
  local_24 = *(undefined2 *)(input_params->param_b).values.super_array<unsigned_char,_3UL>.elems;
  acStack_1d[3] = 0xff;
  acStack_1d[1] = -1;
  acStack_1d[2] = -1;
  lVar9 = 2;
  do {
    if (lVar9 == -1) {
      aVar6.elems[0] = local_20.elems[0];
      aVar6.elems[1] = local_20.elems[1];
      aVar6.elems[2] = local_20.elems[2];
      return (result_type)aVar6.elems;
    }
    pcVar2 = (char *)((long)&local_24 + lVar9);
    lVar5 = lVar9 + 1;
    lVar9 = lVar9 + -1;
  } while (*pcVar2 == acStack_1d[lVar5]);
  goto LAB_00145534;
code_r0x001454d0:
  pvVar7 = local_2c.values.super_array<unsigned_char,_3UL>.elems + lVar9;
  pvVar1 = local_28.values.super_array<unsigned_char,_3UL>.elems + lVar9;
  lVar9 = lVar9 + -1;
  if (*pvVar7 != *pvVar1) goto code_r0x001454e1;
  goto LAB_001454ca;
code_r0x001454e1:
  uVar4 = *(undefined3 *)(input_params->param_b).values.super_array<unsigned_char,_3UL>.elems;
LAB_00145534:
  local_24 = (short)uVar3;
  local_22 = (char)((uint3)uVar3 >> 0x10);
  local_2c.values.super_array<unsigned_char,_3UL>.elems[2] =
       (value_type_conflict4)((uint3)uVar4 >> 0x10);
  local_2c.values.super_array<unsigned_char,_3UL>.elems[0] = (value_type_conflict4)(short)uVar4;
  local_2c.values.super_array<unsigned_char,_3UL>.elems[1] = SUB21((short)uVar4,1);
  lVar9 = 0;
  uVar8 = 0;
  do {
    uVar10 = (local_2c.values.super_array<unsigned_char,_3UL>.elems[lVar9] - uVar8) -
             (ushort)*(byte *)((long)&local_24 + lVar9);
    uVar8 = (ushort)(0xff < uVar10);
    local_2c.values.super_array<unsigned_char,_3UL>.elems[lVar9] = (value_type_conflict4)uVar10;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_28.values.super_array<unsigned_char,_3UL>.elems[2] =
       local_2c.values.super_array<unsigned_char,_3UL>.elems[2];
  local_28.values.super_array<unsigned_char,_3UL>.elems[0] =
       local_2c.values.super_array<unsigned_char,_3UL>.elems[0];
  local_28.values.super_array<unsigned_char,_3UL>.elems[1] =
       local_2c.values.super_array<unsigned_char,_3UL>.elems[1];
  lVar9 = 0;
  do {
    pvVar7 = local_28.values.super_array<unsigned_char,_3UL>.elems + lVar9;
    *pvVar7 = *pvVar7 + '\x01';
    if (*pvVar7 != '\0') break;
    bVar14 = lVar9 != 2;
    lVar9 = lVar9 + 1;
  } while (bVar14);
  local_2c.values.super_array<unsigned_char,_3UL>.elems[2] = '\0';
  local_2c.values.super_array<unsigned_char,_3UL>.elems[0] = '\0';
  local_2c.values.super_array<unsigned_char,_3UL>.elems[1] = '\0';
  uintwide_t<24U,_unsigned_char,_void,_false>::eval_divide_knuth
            ((uintwide_t<24U,_unsigned_char,_void,_false> *)&local_20,&local_28,&local_2c);
  local_20.elems[2] = local_2c.values.super_array<unsigned_char,_3UL>.elems[2];
  local_20.elems[0] = local_2c.values.super_array<unsigned_char,_3UL>.elems[0];
  local_20.elems[1] = local_2c.values.super_array<unsigned_char,_3UL>.elems[1];
  local_2c.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
       *(undefined2 *)(input_params->param_a).values.super_array<unsigned_char,_3UL>.elems;
  local_2c.values.super_array<unsigned_char,_3UL>.elems[2] =
       (input_params->param_a).values.super_array<unsigned_char,_3UL>.elems[2];
  uintwide_t<24U,_unsigned_char,_void,_false>::operator+=
            ((uintwide_t<24U,_unsigned_char,_void,_false> *)&local_20,&local_2c);
  return (representation_type)(representation_type)local_20.elems;
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }